

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

deInt32 vkt::texture::util::wrapTexelCoord(deInt32 coord,int size,VkSamplerAddressMode wrap)

{
  deInt32 dVar1;
  deInt32 local_18;
  deInt32 wrappedCoord;
  VkSamplerAddressMode wrap_local;
  int size_local;
  deInt32 coord_local;
  
  local_18 = 0;
  switch(wrap) {
  case VK_SAMPLER_ADDRESS_MODE_REPEAT:
    local_18 = mod(coord,size);
    break;
  case VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT:
    dVar1 = mod(coord,size << 1);
    dVar1 = mirror(dVar1 - size);
    local_18 = (size + -1) - dVar1;
    break;
  case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE:
    local_18 = de::clamp<int>(coord,0,size + -1);
    break;
  case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER:
    local_18 = de::clamp<int>(coord,-1,size);
    break;
  case VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE:
    dVar1 = mirror(coord);
    local_18 = de::clamp<int>(dVar1,0,size + -1);
  }
  return local_18;
}

Assistant:

deInt32 wrapTexelCoord (const deInt32 coord,
						const int size,
						const VkSamplerAddressMode wrap)
{
	deInt32 wrappedCoord = 0;

	switch (wrap)
	{
		case VK_SAMPLER_ADDRESS_MODE_REPEAT:
			wrappedCoord = mod(coord, size);
			break;

		case VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT:
			wrappedCoord = (size - 1) - mirror(mod(coord, 2 * size) - size);
			break;

		case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE:
			wrappedCoord = de::clamp(coord, 0, (deInt32) size - 1);
			break;

		case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER:
			wrappedCoord = de::clamp(coord, -1, (deInt32) size);
			break;

		case VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE:
			wrappedCoord = de::clamp(mirror(coord), 0, (deInt32) size - 1);
			break;

		default:
			DE_FATAL("Invalid VkSamplerAddressMode");
			break;
	}

	return wrappedCoord;
}